

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O2

void cilk_fiber_pool_move_fibers_to_parent_pool(cilk_fiber_pool *pool,uint num_to_keep)

{
  uint uVar1;
  uint uVar2;
  cilk_fiber_pool *pcVar3;
  cilk_fiber *pcVar4;
  uint uVar5;
  
  pcVar3 = pool->parent;
  if (pcVar3 == (cilk_fiber_pool *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                  ,0xc6,"pool->parent");
  }
  if (pcVar3->size < pcVar3->max_size) {
    spin_mutex_lock(pcVar3->lock);
    uVar1 = pcVar3->max_size;
    uVar5 = pcVar3->size;
    while ((uVar5 < uVar1 && (num_to_keep < pool->size))) {
      uVar5 = pool->size - 1;
      pool->size = uVar5;
      pcVar4 = pool->fibers[uVar5];
      uVar2 = pcVar3->size;
      uVar5 = uVar2 + 1;
      pcVar3->size = uVar5;
      pcVar3->fibers[uVar2] = pcVar4;
    }
    if (pool->total < 0) {
      pcVar3->total = pcVar3->total + pool->total;
      pool->total = 0;
    }
    spin_mutex_unlock(pool->parent->lock);
    return;
  }
  return;
}

Assistant:

static void cilk_fiber_pool_move_fibers_to_parent_pool(cilk_fiber_pool* pool,
                                                       unsigned num_to_keep)
{
    // ASSERT: We should hold the lock on pool (if it has one).
    CILK_ASSERT(pool->parent);
    cilk_fiber_pool* parent_pool = pool->parent;

    // Move fibers from our pool to the parent until we either run out
    // of space in the parent, or hit our threshold.
    //
    // This operation must be done while holding the parent lock.

    // If the parent pool appears to be full, just return early.
    if (parent_pool->size >= parent_pool->max_size)
        return;

    spin_mutex_lock(pool->parent->lock);
    while ((parent_pool->size < parent_pool->max_size) &&
           (pool->size > num_to_keep)) {
        parent_pool->fibers[parent_pool->size++] =
            pool->fibers[--pool->size];
    }

    // If the child pool has deallocated more than fibers to the heap
    // than it has allocated, then transfer this "surplus" to the
    // parent, so that the parent is free to allocate more from the
    // heap.
    // 
    // This transfer means that the total in the parent can
    // temporarily go negative.
    if (pool->total < 0) {
        // Reduce parent total by the surplus we have in the local
        // pool.
        parent_pool->total += pool->total;
        pool->total = 0;
    }

    spin_mutex_unlock(pool->parent->lock);
}